

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O0

int cgltf_json_to_int(jsmntok_t *tok,uint8_t *json_chunk)

{
  int local_b0;
  char local_a8 [4];
  int size;
  char tmp [128];
  uint8_t *json_chunk_local;
  jsmntok_t *tok_local;
  
  if (tok->type == JSMN_PRIMITIVE) {
    if ((uint)(tok->end - tok->start) < 0x80) {
      local_b0 = tok->end - tok->start;
    }
    else {
      local_b0 = 0x7f;
    }
    strncpy(local_a8,(char *)(json_chunk + tok->start),(long)local_b0);
    local_a8[local_b0] = '\0';
    tok_local._4_4_ = atoi(local_a8);
  }
  else {
    tok_local._4_4_ = -1;
  }
  return tok_local._4_4_;
}

Assistant:

static int cgltf_json_to_int(jsmntok_t const* tok, const uint8_t* json_chunk)
{
    CGLTF_CHECK_TOKTYPE(*tok, JSMN_PRIMITIVE);
    char tmp[128];
    int size = (cgltf_size)(tok->end - tok->start) < sizeof(tmp) ? tok->end - tok->start : (int)(sizeof(tmp) - 1);
    strncpy(tmp, (const char*)json_chunk + tok->start, size);
    tmp[size] = 0;
    return atoi(tmp);
}